

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O0

vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
* __thiscall
tandem::detail::get_sorted_buckets<std::__cxx11::string>
          (vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
           *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          vector<tandem::LZBlock,_std::allocator<tandem::LZBlock>_> *lz_blocks,uint32_t min_period,
          uint32_t max_period)

{
  bool bVar1;
  size_t n;
  reference this_00;
  reference __x;
  reference this_01;
  Repeat *run;
  iterator __end0_1;
  iterator __begin0_1;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *__range3;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *bucket;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  *__range2;
  undefined1 local_40 [8];
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  end_buckets;
  uint32_t max_period_local;
  uint32_t min_period_local;
  vector<tandem::LZBlock,_std::allocator<tandem::LZBlock>_> *lz_blocks_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  *result;
  
  end_buckets.
  super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = SUB84(lz_blocks,0);
  end_buckets.
  super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = min_period;
  get_end_buckets<std::__cxx11::string>
            ((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
              *)local_40,this,str,
             (vector<tandem::LZBlock,_std::allocator<tandem::LZBlock>_> *)
             ((ulong)lz_blocks & 0xffffffff),min_period,max_period);
  n = std::__cxx11::string::size();
  get_init_buckets(__return_storage_ptr__,n,
                   (vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                    *)local_40);
  __end0 = std::
           vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
           ::begin((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                    *)local_40);
  bucket = (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)
           std::
           vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
           ::end((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                  *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_*,_std::vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>_>
                                     *)&bucket), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_*,_std::vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>_>
              ::operator*(&__end0);
    __end0_1 = std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::begin(this_00);
    run = (Repeat *)std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                               *)&run), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
            ::operator*(&__end0_1);
      this_01 = std::
                vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                ::operator[](__return_storage_ptr__,(ulong)__x->pos);
      std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::push_back(this_01,__x);
      __gnu_cxx::
      __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
      ::operator++(&__end0_1);
    }
    std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::clear(this_00);
    std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::shrink_to_fit(this_00);
    __gnu_cxx::
    __normal_iterator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_*,_std::vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ::~vector((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Repeat>>
get_sorted_buckets(const T& str, const std::vector<LZBlock>& lz_blocks,
                   const std::uint32_t min_period, const std::uint32_t max_period)
{
    auto end_buckets = get_end_buckets(str, lz_blocks, min_period, max_period);
    auto result = get_init_buckets(str.size(), end_buckets);
    for (auto& bucket : end_buckets) {
        for (const auto& run : bucket) {
            result[run.pos].push_back(run);
        }
        bucket.clear();
        bucket.shrink_to_fit();
    }
    return result;
}